

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O1

bool __thiscall RealCommandRunner::CanRunMore(RealCommandRunner *this)

{
  pointer ppSVar1;
  pointer ppSVar2;
  _Map_pointer pppSVar3;
  bool bVar4;
  double dVar5;
  
  ppSVar1 = (this->subprocs_).running_.
            super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppSVar2 = (this->subprocs_).running_.
            super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pppSVar3 = *(_Map_pointer *)
              ((long)&(this->subprocs_).finished_.c.
                      super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                      super__Deque_impl_data._M_finish + 0x18);
  if ((int)((int)((ulong)((long)*(_Elt_pointer *)
                                 ((long)&(this->subprocs_).finished_.c.
                                         super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>
                                         ._M_impl.super__Deque_impl_data._M_start + 0x10) -
                         (long)(this->subprocs_).finished_.c.
                               super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                               _M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) +
            (int)((ulong)((long)(this->subprocs_).finished_.c.
                                super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                                _M_impl.super__Deque_impl_data._M_finish._M_cur -
                         (long)*(_Elt_pointer *)
                                ((long)&(this->subprocs_).finished_.c.
                                        super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>
                                        ._M_impl.super__Deque_impl_data._M_finish + 8)) >> 3) +
            (int)((ulong)((long)ppSVar1 - (long)ppSVar2) >> 3) +
           ((((uint)((int)pppSVar3 -
                    *(int *)((long)&(this->subprocs_).finished_.c.
                                    super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                                    _M_impl.super__Deque_impl_data._M_start + 0x18)) >> 3) - 1) +
           (uint)(pppSVar3 == (_Map_pointer)0x0)) * 0x40) < *(int *)(this->config_ + 8)) {
    bVar4 = true;
    if ((ppSVar2 != ppSVar1) && (0.0 < *(double *)(this->config_ + 0x10))) {
      dVar5 = GetLoadAverage();
      bVar4 = dVar5 < *(double *)(this->config_ + 0x10);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool RealCommandRunner::CanRunMore() const {
  size_t subproc_number =
      subprocs_.running_.size() + subprocs_.finished_.size();
  return (int)subproc_number < config_.parallelism
    && ((subprocs_.running_.empty() || config_.max_load_average <= 0.0f)
        || GetLoadAverage() < config_.max_load_average);
}